

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int Fl::clipboard_contains(char *type)

{
  _func_int **pp_Var1;
  Display *pDVar2;
  Atom AVar3;
  Atom AVar4;
  int iVar5;
  Fl_Window *w;
  Window WVar6;
  bool local_151;
  int local_12c;
  int retval;
  Atom t;
  Fl_Window *win;
  uchar *portion;
  unsigned_long i;
  unsigned_long remaining;
  unsigned_long count;
  long lStack_f0;
  int format;
  Atom actual;
  XEvent event;
  char *type_local;
  
  portion = (uchar *)0x0;
  win = (Fl_Window *)0x0;
  event.pad[0x17] = (long)type;
  w = first_window();
  if ((w == (Fl_Window *)0x0) ||
     (WVar6 = fl_xid(w), AVar4 = CLIPBOARD, AVar3 = TARGETS, pDVar2 = fl_display, WVar6 == 0)) {
    type_local._4_4_ = 0;
  }
  else {
    WVar6 = fl_xid(w);
    XConvertSelection(pDVar2,AVar4,AVar3,AVar4,WVar6,0);
    XFlush(fl_display);
    do {
      XNextEvent(fl_display,&actual);
      if (((int)actual == 0x1f) && (event.xkey.subwindow == 0)) {
        return 0;
      }
      portion = portion + 1;
      local_151 = portion < (uchar *)0x32 && (int)actual != 0x1f;
    } while (local_151);
    if (portion < (uchar *)0x32) {
      XGetWindowProperty(fl_display,event.xany.display,event.xkey.subwindow,0,4000,0,0,
                         &stack0xffffffffffffff10,(long)&count + 4,&remaining,&i,&win);
      if (lStack_f0 == 4) {
        local_12c = 0;
        iVar5 = strcmp(event._184_8_,"text/plain");
        if (iVar5 == 0) {
          for (portion = (uchar *)0x0; portion < remaining; portion = portion + 1) {
            pp_Var1 = (&(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget)[(long)portion];
            if ((((pp_Var1 == (_func_int **)fl_Xatextplainutf) ||
                 (pp_Var1 == (_func_int **)fl_Xatextplainutf2)) ||
                (pp_Var1 == (_func_int **)fl_Xatextplain)) ||
               (pp_Var1 == (_func_int **)fl_XaUtf8String)) {
              local_12c = 1;
              break;
            }
          }
        }
        else {
          iVar5 = strcmp(event._184_8_,"image");
          if (iVar5 == 0) {
            for (portion = (uchar *)0x0; portion < remaining; portion = portion + 1) {
              pp_Var1 = (&(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget)[(long)portion];
              if ((pp_Var1 == (_func_int **)fl_XaImageBmp) ||
                 (pp_Var1 == (_func_int **)fl_XaImagePNG)) {
                local_12c = 1;
                break;
              }
            }
          }
        }
        XFree(win);
        type_local._4_4_ = local_12c;
      }
      else {
        type_local._4_4_ = 0;
      }
    }
    else {
      type_local._4_4_ = 0;
    }
  }
  return type_local._4_4_;
}

Assistant:

int Fl::clipboard_contains(const char *type)
{
  XEvent event;
  Atom actual; int format; unsigned long count, remaining, i = 0;
  unsigned char* portion = NULL;
  Fl_Window *win = Fl::first_window();
  if (!win || !fl_xid(win)) return 0;
  XConvertSelection(fl_display, CLIPBOARD, TARGETS, CLIPBOARD, fl_xid(win), CurrentTime);
  XFlush(fl_display);
  do  { 
    XNextEvent(fl_display, &event); 
    if (event.type == SelectionNotify && event.xselection.property == None) return 0;
    i++; 
  }
  while (i < 50 && event.type != SelectionNotify);
  if (i >= 50) return 0;
  XGetWindowProperty(fl_display,
		     event.xselection.requestor,
		     event.xselection.property,
		     0, 4000, 0, 0,
		     &actual, &format, &count, &remaining, &portion);
  if (actual != XA_ATOM) return 0;
  Atom t;
  int retval = 0;
  if (strcmp(type, Fl::clipboard_plain_text) == 0) {
    for (i = 0; i<count; i++) { // searching for text data
      t = ((Atom*)portion)[i];
      if (t == fl_Xatextplainutf ||
	  t == fl_Xatextplainutf2 ||
	  t == fl_Xatextplain ||
	  t == fl_XaUtf8String) {
	retval = 1;
	break;
      }
    }	
  }
  else if (strcmp(type, Fl::clipboard_image) == 0) {
    for (i = 0; i<count; i++) { // searching for image data
      t = ((Atom*)portion)[i];
      if (t == fl_XaImageBmp || t == fl_XaImagePNG) {
	retval = 1;
	break;
      }
    }	
  }
  XFree(portion);
  return retval;
}